

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nasm_cfg.cpp
# Opt level: O0

NasmCfg * mocker::buildNasmCfg(NasmCfg *__return_storage_ptr__,LineIter funcBeg,LineIter funcEnd)

{
  LineIter beg;
  size_type sVar1;
  reference pvVar2;
  ulong local_68;
  size_t i;
  undefined1 local_40 [8];
  vector<std::_List_const_iterator<mocker::nasm::Line>,_std::allocator<std::_List_const_iterator<mocker::nasm::Line>_>_>
  blockIters;
  LineIter local_20;
  LineIter funcEnd_local;
  LineIter funcBeg_local;
  NasmCfg *cfg;
  
  blockIters.
  super__Vector_base<std::_List_const_iterator<mocker::nasm::Line>,_std::allocator<std::_List_const_iterator<mocker::nasm::Line>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  local_20._M_node = funcEnd._M_node;
  funcEnd_local = funcBeg;
  NasmCfg::NasmCfg(__return_storage_ptr__);
  anon_unknown_4::splitFunctionIntoBlocks
            ((vector<std::_List_const_iterator<mocker::nasm::Line>,_std::allocator<std::_List_const_iterator<mocker::nasm::Line>_>_>
              *)local_40,funcEnd_local,local_20);
  std::
  vector<std::_List_const_iterator<mocker::nasm::Line>,std::allocator<std::_List_const_iterator<mocker::nasm::Line>>>
  ::emplace_back<std::_List_const_iterator<mocker::nasm::Line>&>
            ((vector<std::_List_const_iterator<mocker::nasm::Line>,std::allocator<std::_List_const_iterator<mocker::nasm::Line>>>
              *)local_40,&local_20);
  local_68 = 0;
  while( true ) {
    sVar1 = std::
            vector<std::_List_const_iterator<mocker::nasm::Line>,_std::allocator<std::_List_const_iterator<mocker::nasm::Line>_>_>
            ::size((vector<std::_List_const_iterator<mocker::nasm::Line>,_std::allocator<std::_List_const_iterator<mocker::nasm::Line>_>_>
                    *)local_40);
    if (sVar1 - 1 <= local_68) break;
    pvVar2 = std::
             vector<std::_List_const_iterator<mocker::nasm::Line>,_std::allocator<std::_List_const_iterator<mocker::nasm::Line>_>_>
             ::operator[]((vector<std::_List_const_iterator<mocker::nasm::Line>,_std::allocator<std::_List_const_iterator<mocker::nasm::Line>_>_>
                           *)local_40,local_68);
    beg._M_node = pvVar2->_M_node;
    pvVar2 = std::
             vector<std::_List_const_iterator<mocker::nasm::Line>,_std::allocator<std::_List_const_iterator<mocker::nasm::Line>_>_>
             ::operator[]((vector<std::_List_const_iterator<mocker::nasm::Line>,_std::allocator<std::_List_const_iterator<mocker::nasm::Line>_>_>
                           *)local_40,local_68 + 1);
    NasmCfg::addNode(__return_storage_ptr__,beg,pvVar2->_M_node);
    local_68 = local_68 + 1;
  }
  NasmCfg::buildGraph(__return_storage_ptr__);
  blockIters.
  super__Vector_base<std::_List_const_iterator<mocker::nasm::Line>,_std::allocator<std::_List_const_iterator<mocker::nasm::Line>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  std::
  vector<std::_List_const_iterator<mocker::nasm::Line>,_std::allocator<std::_List_const_iterator<mocker::nasm::Line>_>_>
  ::~vector((vector<std::_List_const_iterator<mocker::nasm::Line>,_std::allocator<std::_List_const_iterator<mocker::nasm::Line>_>_>
             *)local_40);
  if ((blockIters.
       super__Vector_base<std::_List_const_iterator<mocker::nasm::Line>,_std::allocator<std::_List_const_iterator<mocker::nasm::Line>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    NasmCfg::~NasmCfg(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

NasmCfg buildNasmCfg(LineIter funcBeg, LineIter funcEnd) {
  NasmCfg cfg;

  auto blockIters = splitFunctionIntoBlocks(funcBeg, funcEnd);
  blockIters.emplace_back(funcEnd);
  // add the nodes
  for (std::size_t i = 0; i < blockIters.size() - 1; ++i)
    cfg.addNode(blockIters[i], blockIters[i + 1]);

  cfg.buildGraph();

  return cfg;
}